

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall BasicMethodProperties::~BasicMethodProperties(BasicMethodProperties *this)

{
  BasicMethodProperties *this_local;
  
  StringHolder::~StringHolder(&this->m_string_holder);
  std::__cxx11::string::~string((string *)&this->m_string_value2);
  std::__cxx11::string::~string((string *)&this->m_string_value);
  return;
}

Assistant:

~BasicMethodProperties() = default;